

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O3

bool __thiscall GGSock::FileServer::Impl::updateClientInfos(Impl *this)

{
  int64_t iVar1;
  TProgress TVar2;
  bool bVar3;
  long lVar4;
  mapped_type *pmVar5;
  int iVar6;
  pointer pCVar7;
  key_type_conflict local_2c;
  
  std::
  _Rb_tree<int,_std::pair<const_int,_GGSock::FileServer::ClientInfo>,_std::_Select1st<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
  ::clear(&(this->clientInfos)._M_t);
  local_2c = 0;
  pCVar7 = (this->clients).
           super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->clients).
                              super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7) >> 3) *
          0x3cf3cf3d) {
    do {
      lVar4 = (long)local_2c;
      bVar3 = Communicator::isConnected
                        (pCVar7[lVar4].communicator.
                         super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        );
      if (bVar3) {
        pCVar7 = pCVar7 + lVar4;
        pmVar5 = std::
                 map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
                 ::operator[](&this->clientInfos,&local_2c);
        pmVar5->port = (pCVar7->info).port;
        std::__cxx11::string::_M_assign((string *)&pmVar5->address);
        TVar2 = (pCVar7->info).currentProgress;
        pmVar5->currentFileId = (pCVar7->info).currentFileId;
        pmVar5->currentProgress = TVar2;
        iVar1 = (pCVar7->info).dataRx_bytes;
        pmVar5->dataTx_bytes = (pCVar7->info).dataTx_bytes;
        pmVar5->dataRx_bytes = iVar1;
      }
      local_2c = local_2c + 1;
      pCVar7 = (this->clients).
               super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = (int)((ulong)((long)(this->clients).
                                  super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7) >> 3);
    } while (SBORROW4(local_2c,iVar6 * 0x3cf3cf3d) != local_2c + iVar6 * -0x3cf3cf3d < 0);
  }
  return true;
}

Assistant:

bool updateClientInfos() {
        clientInfos.clear();

        for (int i = 0; i < (int) clients.size(); ++i) {
            const auto & client = clients[i];
            if (client.communicator->isConnected() == false) {
                continue;
            }

            clientInfos[i] = client.info;
        }

        return true;
    }